

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall Js::LocalsWalker::Get(LocalsWalker *this,int i,ResolvedObject *pResolvedObject)

{
  VariableWalkerBase *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 extraout_var;
  Type *ppVVar5;
  undefined4 *puVar6;
  int iVar7;
  VariableWalkerBase *variableWalker;
  int count_1;
  VariableWalkerBase *variableWalker_1;
  int j_1;
  int startScopeIndex;
  int count;
  int j;
  ResolvedObject *pResolvedObject_local;
  LocalsWalker *pLStack_18;
  int i_local;
  LocalsWalker *this_local;
  
  if (i < (int)this->totalLocalsCount) {
    pResolvedObject_local._4_4_ = i;
    pLStack_18 = this;
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
    BVar4 = VariableWalkerBase::GetExceptionObject
                      ((int *)((long)&pResolvedObject_local + 4),this->pFrame,pResolvedObject);
    if (BVar4 == 0) {
      BVar4 = VariableWalkerBase::GetReturnedValue
                        ((int *)((long)&pResolvedObject_local + 4),this->pFrame,pResolvedObject);
      if (BVar4 == 0) {
        if ((this->hasUserNotDefinedArguments & 1U) != 0) {
          if (pResolvedObject_local._4_4_ == 0) {
            BVar4 = CreateArgumentsObject(this,pResolvedObject);
            return BVar4;
          }
          pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - 1;
        }
        if ((this->pVarWalkers ==
             (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0) ||
           (iVar3 = JsUtil::
                    ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ::Count(&this->pVarWalkers->
                             super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                           ), iVar3 == 0)) {
          this_local._4_4_ = 0;
        }
        else {
          bVar2 = ShouldMakeGroups(this);
          if (bVar2) {
            variableWalker_1._4_4_ = 0;
            for (variableWalker_1._0_4_ = 0;
                iVar3 = JsUtil::
                        ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                        ::Count(&this->pVarWalkers->
                                 super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                               ), (int)variableWalker_1 < iVar3;
                variableWalker_1._0_4_ = (int)variableWalker_1 + 1) {
              ppVVar5 = JsUtil::
                        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        ::Item(this->pVarWalkers,(int)variableWalker_1);
              this_00 = *ppVVar5;
              bVar2 = VariableWalkerBase::IsInGroup(this_00);
              if (bVar2) break;
              iVar3 = (*(this_00->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase
                        [1])();
              if ((int)pResolvedObject_local._4_4_ < iVar3) {
                iVar3 = (**(this_00->super_IDiagObjectModelWalkerBase).
                           _vptr_IDiagObjectModelWalkerBase)
                                  (this_00,(ulong)pResolvedObject_local._4_4_,pResolvedObject);
                return iVar3;
              }
              pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - iVar3;
              variableWalker_1._4_4_ = variableWalker_1._4_4_ + 1;
            }
            iVar7 = pResolvedObject_local._4_4_ + variableWalker_1._4_4_;
            iVar3 = JsUtil::
                    ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ::Count(&this->pVarWalkers->
                             super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                           );
            if (iVar3 <= iVar7) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                          ,0x526,"((i + startScopeIndex) < pVarWalkers->Count())",
                                          "(i + startScopeIndex) < pVarWalkers->Count()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            ppVVar5 = JsUtil::
                      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(this->pVarWalkers,pResolvedObject_local._4_4_ + variableWalker_1._4_4_)
            ;
            this_local._4_4_ = VariableWalkerBase::GetGroupObject(*ppVVar5,pResolvedObject);
          }
          else {
            for (startScopeIndex = 0;
                iVar3 = JsUtil::
                        ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                        ::Count(&this->pVarWalkers->
                                 super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                               ), startScopeIndex < iVar3; startScopeIndex = startScopeIndex + 1) {
              ppVVar5 = JsUtil::
                        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        ::Item(this->pVarWalkers,startScopeIndex);
              iVar3 = (*((*ppVVar5)->super_IDiagObjectModelWalkerBase).
                        _vptr_IDiagObjectModelWalkerBase[1])();
              if ((int)pResolvedObject_local._4_4_ < iVar3) {
                ppVVar5 = JsUtil::
                          List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          ::Item(this->pVarWalkers,startScopeIndex);
                iVar3 = (**((*ppVVar5)->super_IDiagObjectModelWalkerBase).
                           _vptr_IDiagObjectModelWalkerBase)
                                  (*ppVVar5,(ulong)pResolvedObject_local._4_4_,pResolvedObject);
                return iVar3;
              }
              pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - iVar3;
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x4ff,"(0)","FALSE");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
            this_local._4_4_ = 0;
          }
        }
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL LocalsWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i >= (int)totalLocalsCount)
        {
            return FALSE;
        }

        pResolvedObject->scriptContext = pFrame->GetScriptContext();

        if (VariableWalkerBase::GetExceptionObject(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Pending mutation display should be before any return value
        if (VariableWalkerBase::GetBreakMutationBreakpointValue(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }
#endif

        if (VariableWalkerBase::GetReturnedValue(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }

        if (hasUserNotDefinedArguments)
        {
            if (i == 0)
            {
                return CreateArgumentsObject(pResolvedObject);
            }
            i--;
        }

        if (!pVarWalkers || pVarWalkers->Count() == 0)
        {
            return FALSE;
        }

        // In the case of not making groups, all variables will be arranged
        // as one int32 list in the locals window.
        if (!ShouldMakeGroups())
        {
            for (int j = 0; j < pVarWalkers->Count(); j++)
            {
                int count = pVarWalkers->Item(j)->GetChildrenCount();
                if (i < count)
                {
                    return pVarWalkers->Item(j)->Get(i, pResolvedObject);
                }
                i-= count;
            }

            Assert(FALSE);
            return FALSE;
        }

        int startScopeIndex = 0;

        // Need to determine what range of local variables we're in for the requested index.
        // Non-grouped local variables are organized with reg slot coming first, then followed by
        // scope slot/activation object variables. Catch and with variables follow next
        // and group variables are stored last which come from upper scopes that
        // are accessed in this function (those passed down as part of a closure).
        // Note that all/any/none of these walkers may be present.
        // Example variable layout:
        // [0-2] - Reg slot vars.
        // [3-4] - Scope slot array vars.
        // [5-8] - Global vars (stored on the global object as properties).
        for (int j = 0; j < pVarWalkers->Count(); ++j)
        {
            VariableWalkerBase *variableWalker = pVarWalkers->Item(j);
            if (!variableWalker->IsInGroup())
            {
                int count = variableWalker->GetChildrenCount();

                if (i < count)
                {
                    return variableWalker->Get(i, pResolvedObject);
                }
                i-= count;
                startScopeIndex++;
            }
            else
            {
                // We've finished with all walkers for the current locals level so
                // break out in order to handle the groups.
                break;
            }
        }

        // Handle groups.
        Assert((i + startScopeIndex) < pVarWalkers->Count());
        VariableWalkerBase *variableWalker = pVarWalkers->Item(i + startScopeIndex);
        return variableWalker->GetGroupObject(pResolvedObject);
    }